

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool absl::lts_20240722::debugging_internal::ParseCallOffset(State *state)

{
  ParseState *pPVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  ComplexityGuard guard;
  ParseState copy;
  
  iVar8 = state->recursion_depth;
  iVar2 = state->steps;
  state->recursion_depth = iVar8 + 1;
  state->steps = iVar2 + 1;
  if (0x1ffff < iVar2 || 0xff < iVar8) {
    bVar6 = false;
    goto LAB_001062db;
  }
  uVar3 = (state->parse_state).mangled_idx;
  uVar4 = (state->parse_state).out_cur_idx;
  uVar5 = *(undefined8 *)&(state->parse_state).prev_name_idx;
  bVar6 = ParseOneCharToken(state,'h');
  if (bVar6) {
    iVar8 = state->recursion_depth;
    iVar2 = state->steps;
    state->recursion_depth = iVar8 + 1;
    state->steps = iVar2 + 1;
    if (0x1ffff < iVar2 || 0xff < iVar8) {
      state->recursion_depth = iVar8;
      goto LAB_00106239;
    }
    bVar6 = ParseNumber(state,(int *)0x0);
    state->recursion_depth = state->recursion_depth + -1;
    if (!bVar6) goto LAB_00106239;
    bVar7 = ParseOneCharToken(state,'_');
    bVar6 = true;
    if (!bVar7) goto LAB_00106239;
  }
  else {
LAB_00106239:
    pPVar1 = &state->parse_state;
    pPVar1->mangled_idx = uVar3;
    pPVar1->out_cur_idx = uVar4;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
    bVar6 = ParseOneCharToken(state,'v');
    if (bVar6) {
      iVar8 = state->recursion_depth;
      iVar2 = state->steps;
      state->recursion_depth = iVar8 + 1;
      state->steps = iVar2 + 1;
      if (iVar2 < 0x20000 && iVar8 < 0x100) {
        bVar6 = ParseNumber(state,(int *)0x0);
        if (((bVar6) && (bVar6 = ParseOneCharToken(state,'_'), bVar6)) &&
           (bVar6 = ParseNumber(state,(int *)0x0), bVar6)) {
          state->recursion_depth = state->recursion_depth + -1;
          bVar7 = ParseOneCharToken(state,'_');
          bVar6 = true;
          if (bVar7) goto LAB_001062d6;
          goto LAB_001062cc;
        }
        iVar8 = state->recursion_depth + -1;
      }
      state->recursion_depth = iVar8;
    }
LAB_001062cc:
    pPVar1->mangled_idx = uVar3;
    pPVar1->out_cur_idx = uVar4;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
    bVar6 = false;
  }
LAB_001062d6:
  iVar8 = state->recursion_depth + -1;
LAB_001062db:
  state->recursion_depth = iVar8;
  return bVar6;
}

Assistant:

static bool ParseCallOffset(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;
  if (ParseOneCharToken(state, 'h') && ParseNVOffset(state) &&
      ParseOneCharToken(state, '_')) {
    return true;
  }
  state->parse_state = copy;

  if (ParseOneCharToken(state, 'v') && ParseVOffset(state) &&
      ParseOneCharToken(state, '_')) {
    return true;
  }
  state->parse_state = copy;

  return false;
}